

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QByteArray * __thiscall
QMap<QByteArray,_QByteArray>::value
          (QByteArray *__return_storage_ptr__,QMap<QByteArray,_QByteArray> *this,QByteArray *key,
          QByteArray *defaultValue)

{
  QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
                 *)0x0) {
    cVar2 = std::
            _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QByteArray>,_std::_Select1st<std::pair<const_QByteArray,_QByteArray>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
            ::find(&(pQVar1->m)._M_t,key);
    if ((_Rb_tree_header *)cVar2._M_node !=
        &(((this->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      p_Var4 = cVar2._M_node[1]._M_right;
      (__return_storage_ptr__->d).d = (Data *)p_Var4;
      (__return_storage_ptr__->d).ptr = *(char **)(cVar2._M_node + 2);
      p_Var3 = cVar2._M_node[2]._M_parent;
      goto LAB_0010a903;
    }
  }
  p_Var4 = (_Base_ptr)(defaultValue->d).d;
  (__return_storage_ptr__->d).d = (Data *)p_Var4;
  (__return_storage_ptr__->d).ptr = (defaultValue->d).ptr;
  p_Var3 = (_Base_ptr)(defaultValue->d).size;
LAB_0010a903:
  (__return_storage_ptr__->d).size = (qsizetype)p_Var3;
  if (p_Var4 != (_Base_ptr)0x0) {
    LOCK();
    p_Var4->_M_color = p_Var4->_M_color + _S_black;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }